

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Single_Quoted_String
          (ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char_type t_char;
  Boxed_Value *param;
  undefined4 uVar2;
  undefined4 col;
  bool bVar3;
  char *pcVar4;
  size_type sVar5;
  eval_error *this_00;
  element_type *peVar6;
  reference pvVar7;
  string_view t_match;
  value_type local_171;
  Boxed_Value local_170;
  __sv_type local_160;
  value_type local_150;
  undefined1 local_145;
  File_Position local_144;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  Position end;
  Position s;
  Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cparser;
  string match;
  Position start;
  Depth_Counter local_20;
  Depth_Counter dc;
  ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser = this;
  Depth_Counter::Depth_Counter(&local_20,this);
  SkipWS(this,false);
  match.field_2._8_4_ = (this->m_position).line;
  match.field_2._12_4_ = (this->m_position).col;
  bVar3 = Single_Quoted_String_(this);
  if (bVar3) {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (cparser.hex_matches.field_2._M_local_buf + 8);
    std::__cxx11::string::string((string *)pbVar1);
    Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Char_Parser((Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&s.m_last_col,pbVar1,false);
    Position::operator+((Position *)&end.m_last_col,(Position *)((long)&match.field_2 + 8),1);
    Position::operator-((Position *)local_118,&this->m_position,1);
    while( true ) {
      bVar3 = Position::operator!=((Position *)&end.m_last_col,(Position *)local_118);
      if (!bVar3) break;
      pcVar4 = Position::operator*((Position *)&end.m_last_col);
      t_char = *pcVar4;
      uVar2 = match.field_2._8_4_;
      col = match.field_2._12_4_;
      peVar6 = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::parse((Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&s.m_last_col,t_char,uVar2,col,peVar6);
      Position::operator++((Position *)&end.m_last_col);
    }
    Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Char_Parser((Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&s.m_last_col);
    sVar5 = Catch::clara::std::__cxx11::
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cparser.hex_matches.field_2 + 8));
    if (sVar5 != 1) {
      local_145 = 1;
      this_00 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"Single-quoted strings must be 1 character long",&local_139);
      File_Position::File_Position(&local_144,(this->m_position).line,(this->m_position).col);
      peVar6 = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(this_00,&local_138,&local_144,peVar6);
      local_145 = 0;
      __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (cparser.hex_matches.field_2._M_local_buf + 8);
    local_160 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar1);
    uVar2 = match.field_2._8_4_;
    param = (Boxed_Value *)((ulong)match.field_2._8_8_ >> 0x20);
    pvVar7 = Catch::clara::std::__cxx11::
             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at(pbVar1,0);
    local_171 = *pvVar7;
    const_var<char>((chaiscript *)&local_170,&local_171);
    t_match._M_str = (char *)local_160._M_len;
    t_match._M_len = (size_t)this;
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::
    make_node<chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>,chaiscript::Boxed_Value>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)&local_150,t_match,(int)local_160._M_str,uVar2,param);
    Catch::clara::std::
    vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
    ::push_back(&this->m_match_stack,&local_150);
    Catch::clara::std::
    unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
    ::~unique_ptr(&local_150);
    Boxed_Value::~Boxed_Value(&local_170);
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)(cparser.hex_matches.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = false;
  }
  Depth_Counter::~Depth_Counter(&local_20);
  return this_local._7_1_;
}

Assistant:

bool Single_Quoted_String() {
        Depth_Counter dc{this};
        SkipWS();

        const auto start = m_position;
        if (Single_Quoted_String_()) {
          std::string match;

          {
            // scope for cparser destructor
            Char_Parser<std::string> cparser(match, false);

            for (auto s = start + 1, end = m_position - 1; s != end; ++s) {
              cparser.parse(*s, start.line, start.col, *m_filename);
            }
          }

          if (match.size() != 1) {
            throw exception::eval_error("Single-quoted strings must be 1 character long",
                                        File_Position(m_position.line, m_position.col),
                                        *m_filename);
          }

          m_match_stack.push_back(make_node<eval::Constant_AST_Node<Tracer>>(match, start.line, start.col, const_var(char(match.at(0)))));
          return true;
        } else {
          return false;
        }
      }